

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall Catch::CompactReporter::printTotals(CompactReporter *this,Totals *totals)

{
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  long lVar4;
  ostream *poVar5;
  size_t sVar6;
  char *pcVar7;
  char *pcVar8;
  Colour colour;
  string qualify_assertions_failed;
  Colour colour_1;
  Colour colour_2;
  long *local_100;
  long local_f8;
  long local_f0 [2];
  long *local_e0;
  long local_d8;
  long local_d0 [2];
  undefined1 local_c0 [8];
  _Alloc_hider local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  undefined1 local_98 [8];
  _Alloc_hider local_90;
  size_type local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  long *local_70;
  long local_68;
  long local_60 [2];
  long *local_50;
  long local_48;
  long local_40 [2];
  
  sVar1 = (totals->testCases).failed;
  sVar6 = (totals->testCases).passed + sVar1 + (totals->testCases).failedButOk;
  if (sVar6 == 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((this->super_StreamingReporterBase).stream,"No tests ran.",0xd);
    return;
  }
  if (sVar1 == sVar6) {
    Colour::use(BrightRed);
    sVar1 = (totals->assertions).failed;
    if (sVar1 == (totals->assertions).passed + sVar1 + (totals->assertions).failedButOk) {
      pcVar7 = "all ";
      if (sVar1 == 2) {
        pcVar7 = "both ";
      }
      pcVar8 = "";
      if (sVar1 != 1) {
        pcVar8 = pcVar7;
      }
      local_100 = local_f0;
      sVar3 = strlen(pcVar8);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_100,pcVar8,pcVar8 + sVar3);
    }
    else {
      local_100 = local_f0;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_100,"");
    }
    poVar5 = (this->super_StreamingReporterBase).stream;
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"Failed ",7);
    sVar1 = (totals->testCases).failed;
    pcVar7 = "all ";
    if (sVar1 == 2) {
      pcVar7 = "both ";
    }
    pcVar8 = "";
    if (sVar1 != 1) {
      pcVar8 = pcVar7;
    }
    local_e0 = local_d0;
    sVar3 = strlen(pcVar8);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,pcVar8,pcVar8 + sVar3);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)local_e0,local_d8);
    sVar1 = (totals->testCases).failed;
    local_70 = local_60;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"test case","");
    local_c0 = (undefined1  [8])sVar1;
    local_b8._M_p = (pointer)&local_a8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_b8,local_70,local_68 + (long)local_70);
    operator<<(poVar5,(pluralise *)local_c0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,", failed ",9);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)local_100,local_f8);
    sVar1 = (totals->assertions).failed;
    local_50 = local_40;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"assertion","");
    local_98 = (undefined1  [8])sVar1;
    local_90._M_p = (pointer)&local_80;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_90,local_50,local_48 + (long)local_50);
    operator<<(poVar5,(pluralise *)local_98);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,".",1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_p != &local_80) {
      operator_delete(local_90._M_p,local_80._M_allocated_capacity + 1);
    }
    if (local_50 != local_40) {
      operator_delete(local_50,local_40[0] + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_p != &local_a8) {
      operator_delete(local_b8._M_p,local_a8._M_allocated_capacity + 1);
    }
    if (local_70 != local_60) {
      operator_delete(local_70,local_60[0] + 1);
    }
    if (local_e0 != local_d0) {
      operator_delete(local_e0,local_d0[0] + 1);
    }
    if (local_100 != local_f0) {
      operator_delete(local_100,local_f0[0] + 1);
    }
    Colour::use(None);
  }
  else {
    sVar1 = (totals->assertions).failed;
    if ((totals->assertions).passed + sVar1 + (totals->assertions).failedButOk == 0) {
      poVar5 = (this->super_StreamingReporterBase).stream;
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"Passed ",7);
      lVar4 = (totals->testCases).failed + (totals->testCases).passed +
              (totals->testCases).failedButOk;
      pcVar7 = "all ";
      if (lVar4 == 2) {
        pcVar7 = "both ";
      }
      pcVar8 = "";
      if (lVar4 != 1) {
        pcVar8 = pcVar7;
      }
      local_98 = (undefined1  [8])&local_88;
      sVar3 = strlen(pcVar8);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_98,pcVar8,pcVar8 + sVar3);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar5,(char *)local_98,(long)local_90._M_p);
      sVar1 = (totals->testCases).passed;
      sVar6 = (totals->testCases).failed;
      sVar2 = (totals->testCases).failedButOk;
      local_100 = local_f0;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_100,"test case","");
      local_c0 = (undefined1  [8])(sVar6 + sVar1 + sVar2);
      local_b8._M_p = (pointer)&local_a8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_b8,local_100,local_f8 + (long)local_100);
      operator<<(poVar5,(pluralise *)local_c0);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," (no assertions).",0x11);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_p != &local_a8) {
        operator_delete(local_b8._M_p,local_a8._M_allocated_capacity + 1);
      }
      if (local_100 != local_f0) {
        operator_delete(local_100,local_f0[0] + 1);
      }
      if (local_98 != (undefined1  [8])&local_88) {
        operator_delete((void *)local_98,local_88 + 1);
      }
    }
    else if (sVar1 == 0) {
      local_50 = (long *)((ulong)local_50 & 0xffffffffffffff00);
      Colour::use(BrightGreen);
      poVar5 = (this->super_StreamingReporterBase).stream;
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"Passed ",7);
      sVar1 = (totals->testCases).passed;
      pcVar7 = "all ";
      if (sVar1 == 2) {
        pcVar7 = "both ";
      }
      pcVar8 = "";
      if (sVar1 != 1) {
        pcVar8 = pcVar7;
      }
      local_100 = local_f0;
      sVar3 = strlen(pcVar8);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_100,pcVar8,pcVar8 + sVar3);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)local_100,local_f8)
      ;
      sVar1 = (totals->testCases).passed;
      local_e0 = local_d0;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"test case","");
      local_c0 = (undefined1  [8])sVar1;
      local_b8._M_p = (pointer)&local_a8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_b8,local_e0,local_d8 + (long)local_e0);
      operator<<(poVar5,(pluralise *)local_c0);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," with ",6);
      sVar1 = (totals->assertions).passed;
      local_70 = local_60;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"assertion","");
      local_98 = (undefined1  [8])sVar1;
      local_90._M_p = (pointer)&local_80;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_90,local_70,local_68 + (long)local_70);
      operator<<(poVar5,(pluralise *)local_98);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,".",1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_p != &local_80) {
        operator_delete(local_90._M_p,local_80._M_allocated_capacity + 1);
      }
      if (local_70 != local_60) {
        operator_delete(local_70,local_60[0] + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_p != &local_a8) {
        operator_delete(local_b8._M_p,local_a8._M_allocated_capacity + 1);
      }
      if (local_e0 != local_d0) {
        operator_delete(local_e0,local_d0[0] + 1);
      }
      if (local_100 != local_f0) {
        operator_delete(local_100,local_f0[0] + 1);
      }
      if (local_50._0_1_ == (string)0x0) {
        Colour::use(None);
      }
    }
    else {
      local_70 = (long *)((ulong)local_70 & 0xffffffffffffff00);
      Colour::use(BrightRed);
      poVar5 = (this->super_StreamingReporterBase).stream;
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"Failed ",7);
      sVar1 = (totals->testCases).failed;
      local_100 = local_f0;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_100,"test case","");
      local_c0 = (undefined1  [8])sVar1;
      local_b8._M_p = (pointer)&local_a8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_b8,local_100,local_f8 + (long)local_100);
      operator<<(poVar5,(pluralise *)local_c0);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,", failed ",9);
      sVar1 = (totals->assertions).failed;
      local_e0 = local_d0;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"assertion","");
      local_98 = (undefined1  [8])sVar1;
      local_90._M_p = (pointer)&local_80;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_90,local_e0,local_d8 + (long)local_e0);
      operator<<(poVar5,(pluralise *)local_98);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,".",1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_p != &local_80) {
        operator_delete(local_90._M_p,local_80._M_allocated_capacity + 1);
      }
      if (local_e0 != local_d0) {
        operator_delete(local_e0,local_d0[0] + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_p != &local_a8) {
        operator_delete(local_b8._M_p,local_a8._M_allocated_capacity + 1);
      }
      if (local_100 != local_f0) {
        operator_delete(local_100,local_f0[0] + 1);
      }
      Colour::use(None);
    }
  }
  return;
}

Assistant:

void printTotals( const Totals& totals ) const {
            if( totals.testCases.total() == 0 ) {
                stream << "No tests ran.";
            }
            else if( totals.testCases.failed == totals.testCases.total() ) {
                Colour colour( Colour::ResultError );
                const std::string qualify_assertions_failed =
                    totals.assertions.failed == totals.assertions.total() ?
                        bothOrAll( totals.assertions.failed ) : "";
                stream <<
                    "Failed " << bothOrAll( totals.testCases.failed )
                              << pluralise( totals.testCases.failed, "test case"  ) << ", "
                    "failed " << qualify_assertions_failed <<
                                 pluralise( totals.assertions.failed, "assertion" ) << ".";
            }
            else if( totals.assertions.total() == 0 ) {
                stream <<
                    "Passed " << bothOrAll( totals.testCases.total() )
                              << pluralise( totals.testCases.total(), "test case" )
                              << " (no assertions).";
            }
            else if( totals.assertions.failed ) {
                Colour colour( Colour::ResultError );
                stream <<
                    "Failed " << pluralise( totals.testCases.failed, "test case"  ) << ", "
                    "failed " << pluralise( totals.assertions.failed, "assertion" ) << ".";
            }
            else {
                Colour colour( Colour::ResultSuccess );
                stream <<
                    "Passed " << bothOrAll( totals.testCases.passed )
                              << pluralise( totals.testCases.passed, "test case"  ) <<
                    " with "  << pluralise( totals.assertions.passed, "assertion" ) << ".";
            }
        }